

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

string * fs_join_abi_cxx11_(string *__return_storage_ptr__,string_view path,string_view other)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  string_view in;
  string o;
  string p;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  path local_90;
  path local_68;
  path local_40;
  
  sVar1 = other._M_len;
  pcVar2 = path._M_str;
  sVar3 = path._M_len;
  if (sVar3 == 0) {
    pcVar2 = other._M_str;
    sVar3 = sVar1;
    if (sVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  }
  else if (sVar1 != 0) {
    fs_drop_slash_abi_cxx11_(&local_b0,path);
    fs_drop_slash_abi_cxx11_(&local_d0,other);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_68,&local_b0,auto_format);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_90,&local_d0,auto_format);
    std::filesystem::__cxx11::operator/(&local_40,&local_68,&local_90);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,&local_40,&local_d1);
    std::filesystem::__cxx11::path::~path(&local_40);
    std::filesystem::__cxx11::path::~path(&local_90);
    std::filesystem::__cxx11::path::~path(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  in._M_str = pcVar2;
  in._M_len = sVar3;
  fs_drop_slash_abi_cxx11_(__return_storage_ptr__,in);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_join(std::string_view path, std::string_view other)
{
  // does not normalize to preserve possible symlinks
  if(path.empty() && other.empty())
    return {};
  if(path.empty())
    return fs_drop_slash(other);
  if(other.empty())
    return fs_drop_slash(path);

  std::string p = fs_drop_slash(path);
  const std::string o = fs_drop_slash(other);

#ifdef HAVE_CXX_FILESYSTEM
  return (std::filesystem::path(p) / o).generic_string();
#else
  if (o.front() == '/' || (fs_is_windows() && fs_is_absolute(o)))
    return o;

  p.push_back('/');

  return p.append(o);
#endif
}